

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::CordFieldGenerator::GenerateAccessorDeclarations
          (CordFieldGenerator *this,Printer *printer)

{
  FieldDescriptor **args;
  Formatter format;
  tuple<const_google::protobuf::FieldDescriptor_*,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
  local_48;
  Formatter local_38;
  
  local_38.printer_ = printer;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_38.vars_,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&(this->super_FieldGeneratorBase).variables_,(allocator_type *)&local_48);
  args = &(this->super_FieldGeneratorBase).field_;
  Formatter::operator()
            (&local_38,"$deprecated_attr$const ::absl::Cord& ${1$$name$$}$() const;\n",args);
  local_48.
  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
  .super__Tuple_impl<1UL,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic>.
  super__Head_base<1UL,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_false>._M_head_impl
       = (_Head_base<1UL,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_false>)
         GeneratedCodeInfo_Annotation_Semantic_SET;
  local_48.
  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
  .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_*,_false>._M_head_impl = *args;
  Formatter::operator()
            (&local_38,
             "$deprecated_attr$void ${1$set_$name$$}$(const ::absl::Cord& value);\n$deprecated_attr$void ${1$set_$name$$}$(::absl::string_view value);\n"
             ,&local_48);
  Formatter::operator()
            (&local_38,
             "private:\nconst ::absl::Cord& ${1$_internal_$name$$}$() const;\nvoid ${1$_internal_set_$name$$}$(const ::absl::Cord& value);\n::absl::Cord* $nonnull$ ${1$_internal_mutable_$name$$}$();\npublic:\n"
             ,args);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_38.vars_);
  return;
}

Assistant:

void CordFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("$deprecated_attr$const ::absl::Cord& ${1$$name$$}$() const;\n",
         field_);
  format(
      "$deprecated_attr$void ${1$set_$name$$}$(const ::absl::Cord& value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(::absl::string_view value);\n",
      std::make_tuple(field_, GeneratedCodeInfo::Annotation::SET));
  format(
      "private:\n"
      "const ::absl::Cord& ${1$_internal_$name$$}$() const;\n"
      "void ${1$_internal_set_$name$$}$(const ::absl::Cord& value);\n"
      "::absl::Cord* $nonnull$ ${1$_internal_mutable_$name$$}$();\n"
      "public:\n",
      field_);
}